

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

size_t __thiscall cxxopts::ParseResult::count(ParseResult *this,string *o)

{
  const_iterator cVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->m_options->_M_h,o);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = std::
             _Hashtable<std::shared_ptr<cxxopts::OptionDetails>,_std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>,_std::allocator<std::pair<const_std::shared_ptr<cxxopts::OptionDetails>,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<cxxopts::OptionDetails>_>,_std::hash<std::shared_ptr<cxxopts::OptionDetails>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_results)._M_h,
                        *(ulong *)((long)cVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                         ._M_cur + 0x28) % (this->m_results)._M_h._M_bucket_count,
                        (key_type *)
                        ((long)cVar1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28),
                        *(ulong *)((long)cVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                         ._M_cur + 0x28));
    p_Var3 = p_Var2->_M_nxt[5]._M_nxt;
  }
  return (size_t)p_Var3;
}

Assistant:

size_t
        count(const std::string& o) const
        {
            auto iter = m_options.find(o);
            if (iter == m_options.end())
            {
                return 0;
            }

            auto riter = m_results.find(iter->second);

            return riter->second.count();
        }